

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

QByteArray * qCreatev2Hash(QAuthenticatorPrivate *ctx,QNtlmPhase3Block *phase3)

{
  QByteArrayView message_00;
  qsizetype qVar1;
  QByteArrayView *in_RDX;
  QStringBuilder<QByteArray,_QByteArray> *in_RDI;
  long in_FS_OFFSET;
  QByteArray message;
  QByteArray hashKey;
  QByteArray passUnicode;
  QCryptographicHash md4;
  QStringBuilder<QByteArray,_QByteArray> *in_stack_fffffffffffffec8;
  QStringBuilder<QByteArray,_QByteArray> *ba;
  QString *in_stack_fffffffffffffef8;
  QByteArray *in_stack_ffffffffffffff00;
  storage_type *psVar2;
  
  psVar2 = *(storage_type **)(in_FS_OFFSET + 0x28);
  ba = in_RDI;
  qVar1 = QByteArray::size((QByteArray *)(in_RDX + 0xd));
  if (qVar1 == 0) {
    qVar1 = -0x5555555555555556;
    QCryptographicHash::QCryptographicHash((QCryptographicHash *)&stack0xfffffffffffffff0,Md4);
    qStringAsUcs2Le(in_stack_fffffffffffffef8);
    QByteArrayView::QByteArrayView<QByteArray,_true>(in_RDX,&ba->a);
    QCryptographicHash::addData((QByteArrayView *)&stack0xfffffffffffffff0);
    QCryptographicHash::result();
    QString::toUpper((QString *)in_stack_fffffffffffffec8);
    qStringAsUcs2Le(in_stack_fffffffffffffef8);
    qStringAsUcs2Le(in_stack_fffffffffffffef8);
    operator+(&ba->a,&in_RDI->a);
    QStringBuilder::operator_cast_to_QByteArray(in_stack_fffffffffffffec8);
    QStringBuilder<QByteArray,_QByteArray>::~QStringBuilder(in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x20acff);
    QByteArray::~QByteArray((QByteArray *)0x20ad0c);
    QString::~QString((QString *)0x20ad16);
    QByteArrayView::QByteArrayView<QByteArray,_true>(in_RDX,&ba->a);
    message_00.m_data = psVar2;
    message_00.m_size = qVar1;
    qEncodeHmacMd5(in_stack_ffffffffffffff00,message_00);
    QByteArray::operator=(&in_RDI->a,&in_stack_fffffffffffffec8->a);
    QByteArray::~QByteArray((QByteArray *)0x20ad64);
    QByteArray::~QByteArray((QByteArray *)0x20ad71);
    QByteArray::~QByteArray((QByteArray *)0x20ad7e);
    QByteArray::~QByteArray((QByteArray *)0x20ad8b);
    QCryptographicHash::~QCryptographicHash((QCryptographicHash *)&stack0xfffffffffffffff0);
  }
  QByteArray::QByteArray(&in_RDI->a,&in_stack_fffffffffffffec8->a);
  if (*(storage_type **)(in_FS_OFFSET + 0x28) == psVar2) {
    return &ba->a;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray qCreatev2Hash(const QAuthenticatorPrivate *ctx,
                                QNtlmPhase3Block *phase3)
{
    Q_ASSERT(phase3 != nullptr);
    // since v2 Hash is need for both NTLMv2 and LMv2 it is calculated
    // only once and stored and reused
    if (phase3->v2Hash.size() == 0) {
        QCryptographicHash md4(QCryptographicHash::Md4);
        QByteArray passUnicode = qStringAsUcs2Le(ctx->password);
        md4.addData(passUnicode);

        QByteArray hashKey = md4.result();
        Q_ASSERT(hashKey.size() == 16);
        // Assuming the user and domain is always unicode in challenge
        QByteArray message =
                qStringAsUcs2Le(ctx->extractedUser.toUpper()) +
                qStringAsUcs2Le(phase3->domainStr);

        phase3->v2Hash = qEncodeHmacMd5(hashKey, message);
    }
    return phase3->v2Hash;
}